

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::CodedOutputStream
          (CodedOutputStream *this,ZeroCopyOutputStream *stream,bool do_eager_refresh)

{
  bool deterministic;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint8 *puVar3;
  byte in_DL;
  ZeroCopyOutputStream *in_RSI;
  EpsCopyOutputStream *in_RDI;
  int size;
  void *data;
  int local_24;
  void *local_20;
  byte local_11;
  ZeroCopyOutputStream *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  deterministic = IsDefaultSerializationDeterministic();
  EpsCopyOutputStream::EpsCopyOutputStream(in_RDI,in_RSI,deterministic,&in_RDI[1].end_);
  iVar1 = (*local_10->_vptr_ZeroCopyOutputStream[4])();
  in_RDI[1].buffer_end_ = (uint8 *)CONCAT44(extraout_var,iVar1);
  if ((((local_11 & 1) != 0) &&
      (uVar2 = (*local_10->_vptr_ZeroCopyOutputStream[2])(local_10,&local_20,&local_24),
      (uVar2 & 1) != 0)) && (local_24 != 0)) {
    puVar3 = EpsCopyOutputStream::SetInitialBuffer(in_RDI,local_20,local_24);
    in_RDI[1].end_ = puVar3;
  }
  return;
}

Assistant:

CodedOutputStream::CodedOutputStream(ZeroCopyOutputStream* stream,
                                     bool do_eager_refresh)
    : impl_(stream, IsDefaultSerializationDeterministic(), &cur_),
      start_count_(stream->ByteCount()) {
  if (do_eager_refresh) {
    void* data;
    int size;
    if (!stream->Next(&data, &size) || size == 0) return;
    cur_ = impl_.SetInitialBuffer(data, size);
  }
}